

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

type * check_declarator(c2m_ctx_t c2m_ctx,node_t_conflict r,int func_def_p)

{
  uchar uVar1;
  node_code_t nVar2;
  type_mode tVar3;
  check_ctx *pcVar4;
  node_t pnVar5;
  node_t pnVar6;
  byte *pbVar7;
  long lVar8;
  check_ctx_t check_ctx;
  node_t pnVar9;
  type *el;
  arr_type *paVar10;
  node_t_conflict pnVar11;
  decl_spec *pdVar12;
  type *ptVar13;
  node_t pnVar14;
  c2m_ctx_t el_00;
  c2m_ctx_t pcVar15;
  node_t pnVar16;
  anon_union_8_5_3fbb1736_for_u *paVar17;
  pos_t pVar18;
  
  pnVar9 = (r->u).ops.head;
  if (pnVar9 == (node_t)0x0) {
    pnVar9 = (node_t)0x0;
  }
  else {
    pnVar9 = (pnVar9->op_link).next;
  }
  if (r->code != N_DECL) {
    __assert_fail("r->code == N_DECL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1b49,"struct type *check_declarator(c2m_ctx_t, node_t, int)");
  }
  pnVar9 = (pnVar9->u).ops.head;
  if (pnVar9 == (node_t)0x0) {
    ptVar13 = (type *)0x0;
  }
  else {
    pcVar4 = c2m_ctx->check_ctx;
    ptVar13 = (type *)0x0;
    do {
      el = (type *)reg_malloc(c2m_ctx,0x38);
      *(byte *)&el->type_qual = *(byte *)&el->type_qual & 0xf0;
      el->mode = TM_UNDEF;
      el->antialias = 0;
      el->arr_type = (type *)0x0;
      el->align = -1;
      el->raw_size = 0xffffffffffffffff;
      el->func_type_before_adjustment_p = '\0';
      el->unnamed_anon_struct_union_member_type_p = '\0';
      el->pos_node = pnVar9;
      nVar2 = pnVar9->code;
      if (nVar2 == N_FUNC) {
        pnVar16 = (pnVar9->u).ops.head;
        el_00 = (c2m_ctx_t)0x20;
        uVar1 = pcVar4->in_params_p;
        pnVar5 = (pnVar16->u).ops.tail;
        el->mode = TM_FUNC;
        el->pos_node = pnVar9;
        pcVar15 = c2m_ctx;
        pnVar11 = (node_t_conflict)reg_malloc(c2m_ctx,0x20);
        (el->u).tag_type = pnVar11;
        pnVar11->attr = (void *)0x0;
        (pnVar11->op_link).next = (node_t)0x0;
        if (pnVar5 == (node_t)0x0) {
          *(undefined1 *)&pnVar11->code = (char)pnVar11->code & (N_ATTR|N_MODULE);
        }
        else {
          nVar2 = pnVar5->code;
          *(undefined1 *)&pnVar11->code = (char)pnVar11->code & (N_ATTR|N_MODULE) | nVar2 == N_DOTS;
          if (nVar2 == N_DOTS) {
            pnVar6 = (pnVar5->op_link).prev;
            if (pnVar6 == (node_t)0x0) {
              if ((node_t)(pnVar16->u).s.s != pnVar5) {
                check_declarator_cold_1();
                goto LAB_00186b99;
              }
              pnVar14 = (pnVar5->op_link).next;
              (pnVar16->u).ops.head = pnVar14;
            }
            else {
              pnVar14 = (pnVar5->op_link).next;
              (pnVar6->op_link).next = pnVar14;
            }
            if (pnVar14 == (node_t)0x0) {
              if ((node_t)(pnVar16->u).s.len != pnVar5) {
LAB_00186b99:
                check_declarator_cold_2();
                if (pcVar15 != (c2m_ctx_t)0x0) {
                  tVar3 = *(type_mode *)((long)pcVar15->env[0].__jmpbuf + 8);
                  if ((tVar3 == TM_FUNC) || (tVar3 == TM_ARR)) {
                    paVar17 = (anon_union_8_5_3fbb1736_for_u *)
                              &((anon_union_8_5_3fbb1736_for_u *)
                               ((long)pcVar15->env[0].__jmpbuf + 0x20))->ptr_type->arr_type;
                  }
                  else {
                    if (tVar3 != TM_PTR) {
                      __assert_fail("head->mode == TM_FUNC",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                    ,0x1b18,"struct type *append_type(struct type *, struct type *)"
                                   );
                    }
                    paVar17 = (anon_union_8_5_3fbb1736_for_u *)
                              ((long)pcVar15->env[0].__jmpbuf + 0x20);
                  }
                  ptVar13 = append_type(paVar17->ptr_type,(type *)el_00);
                  paVar17->ptr_type = ptVar13;
                  el_00 = pcVar15;
                }
                return (type *)el_00;
              }
              (pnVar16->u).ops.tail = pnVar6;
            }
            else {
              (pnVar14->op_link).prev = pnVar6;
            }
            (pnVar5->op_link).prev = (node_t)0x0;
            (pnVar5->op_link).next = (node_t)0x0;
          }
        }
        if (func_def_p == 0) {
          create_node_scope(c2m_ctx,pnVar9);
        }
        (pnVar11->op_link).prev = pnVar16;
        pcVar4->in_params_p = '\x01';
        pnVar11 = (pnVar16->u).ops.head;
        if (pnVar11 != (node_t_conflict)0x0) {
          pnVar16 = pnVar11;
          if ((pnVar11->code != N_ID) && (check(c2m_ctx,pnVar11,pnVar9), pnVar11->code == N_TYPE)) {
            pbVar7 = (byte *)pnVar11->attr;
            lVar8 = *(long *)(pbVar7 + 0x18);
            if ((*(int *)(lVar8 + 0x18) == 1) && (*(int *)(lVar8 + 0x30) == 1)) {
              if (((((*pbVar7 & 0xef) != 0) || (*pbVar7 != 0)) || (*(long *)(pbVar7 + 8) != 0)) ||
                 ((*(byte *)(lVar8 + 0x14) & 0xf) != 0)) {
                pVar18 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                      (node_t_conflict)(ulong)pnVar11->uid);
                error(c2m_ctx,0x1c054c,pVar18.fname,pVar18._8_8_);
              }
              if ((pnVar11->op_link).next != (node_t)0x0) {
                pVar18 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                      (node_t_conflict)(ulong)pnVar11->uid);
                error(c2m_ctx,0x1c0565,pVar18.fname,pVar18._8_8_);
              }
              goto LAB_00186aa3;
            }
          }
          do {
            if (pnVar16->code == N_ID) {
              if (func_def_p == 0) {
                pVar18 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                      (node_t_conflict)(ulong)pnVar16->uid);
                error(c2m_ctx,0x1c0585,pVar18.fname,pVar18._8_8_);
                pcVar4->in_params_p = uVar1;
                goto LAB_00186b08;
              }
              pcVar4->in_params_p = uVar1;
              goto LAB_00186b1d;
            }
            if (pnVar16 != pnVar11) {
              check(c2m_ctx,pnVar16,pnVar9);
            }
            pdVar12 = get_param_decl_spec(pnVar16);
            adjust_param_type(c2m_ctx,&pdVar12->type);
            pnVar16 = (pnVar16->op_link).next;
          } while (pnVar16 != (node_t)0x0);
        }
LAB_00186aa3:
        pcVar4->in_params_p = uVar1;
        if (func_def_p == 0) {
LAB_00186b08:
          c2m_ctx->check_ctx->curr_scope =
               *(node_t_conflict *)((long)c2m_ctx->check_ctx->curr_scope->attr + 0x20);
        }
      }
      else if (nVar2 == N_ARR) {
        pnVar16 = (pnVar9->u).ops.head;
        pnVar5 = (pnVar16->op_link).next;
        pnVar11 = (pnVar5->op_link).next;
        el->mode = TM_ARR;
        el->pos_node = pnVar9;
        paVar10 = (arr_type *)reg_malloc(c2m_ctx,0x20);
        (el->u).arr_type = paVar10;
        *(byte *)&paVar10->ind_type_qual = *(byte *)&paVar10->ind_type_qual & 0xf0;
        set_type_qual(c2m_ctx,(pnVar5->u).ops.head,&paVar10->ind_type_qual,TM_UNDEF);
        check(c2m_ctx,pnVar11,pnVar9);
        paVar10->size = pnVar11;
        *(byte *)paVar10 = *(byte *)paVar10 & 0xfe | pnVar16->code == N_STATIC;
        paVar10->el_type = (type *)0x0;
      }
      else {
        if (nVar2 != N_POINTER) {
          abort();
        }
        pnVar16 = (pnVar9->u).ops.head;
        el->mode = TM_PTR;
        el->pos_node = pnVar9;
        (el->u).tag_type = (node_t_conflict)0x0;
        set_type_qual(c2m_ctx,(pnVar16->u).ops.head,&el->type_qual,TM_PTR);
      }
LAB_00186b1d:
      ptVar13 = append_type(ptVar13,el);
      pnVar9 = (pnVar9->op_link).next;
    } while (pnVar9 != (node_t)0x0);
  }
  return ptVar13;
}

Assistant:

static struct type *check_declarator (c2m_ctx_t c2m_ctx, node_t r, int func_def_p) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  struct type *type, *res = NULL;
  node_t list = NL_EL (r->u.ops, 1);

  assert (r->code == N_DECL);
  if (NL_HEAD (list->u.ops) == NULL) return NULL;
  for (node_t n = NL_HEAD (list->u.ops); n != NULL; n = NL_NEXT (n)) {
    type = create_type (c2m_ctx, NULL);
    type->pos_node = n;
    switch (n->code) {
    case N_POINTER: {
      node_t type_qual = NL_HEAD (n->u.ops);

      type->mode = TM_PTR;
      type->pos_node = n;
      type->u.ptr_type = NULL;
      set_type_qual (c2m_ctx, type_qual, &type->type_qual, TM_PTR);
      break;
    }
    case N_ARR: {
      struct arr_type *arr_type;
      node_t static_node = NL_HEAD (n->u.ops);
      node_t type_qual = NL_NEXT (static_node);
      node_t size = NL_NEXT (type_qual);

      type->mode = TM_ARR;
      type->pos_node = n;
      type->u.arr_type = arr_type = reg_malloc (c2m_ctx, sizeof (struct arr_type));
      clear_type_qual (&arr_type->ind_type_qual);
      set_type_qual (c2m_ctx, type_qual, &arr_type->ind_type_qual, TM_UNDEF);
      check (c2m_ctx, size, n);
      arr_type->size = size;
      arr_type->static_p = static_node->code == N_STATIC;
      arr_type->el_type = NULL;
      break;
    }
    case N_FUNC: {
      struct func_type *func_type;
      node_t first_param, param_list = NL_HEAD (n->u.ops);
      node_t last = NL_TAIL (param_list->u.ops);
      int saved_in_params_p = in_params_p;

      type->mode = TM_FUNC;
      type->pos_node = n;
      type->u.func_type = func_type = reg_malloc (c2m_ctx, sizeof (struct func_type));
      func_type->ret_type = NULL;
      func_type->proto_item = NULL;
      if ((func_type->dots_p = last != NULL && last->code == N_DOTS))
        NL_REMOVE (param_list->u.ops, last);
      if (!func_def_p) create_node_scope (c2m_ctx, n);
      func_type->param_list = param_list;
      in_params_p = TRUE;
      first_param = NL_HEAD (param_list->u.ops);
      if (first_param != NULL && first_param->code != N_ID) check (c2m_ctx, first_param, n);
      if (void_param_p (first_param)) {
        struct decl_spec *ds = first_param->attr;

        if (non_reg_decl_spec_p (ds) || ds->register_p
            || !type_qual_eq_p (&ds->type->type_qual, &zero_type_qual)) {
          error (c2m_ctx, POS (first_param), "qualified void parameter");
        }
        if (NL_NEXT (first_param) != NULL) {
          error (c2m_ctx, POS (first_param), "void must be the only parameter");
        }
      } else {
        for (node_t p = first_param; p != NULL; p = NL_NEXT (p)) {
          struct decl_spec *decl_spec_ptr;

          if (p->code == N_ID) {
            if (!func_def_p)
              error (c2m_ctx, POS (p),
                     "parameters identifier list can be only in function definition");
            break;
          } else {
            if (p != first_param) check (c2m_ctx, p, n);
            decl_spec_ptr = get_param_decl_spec (p);
            adjust_param_type (c2m_ctx, &decl_spec_ptr->type);
          }
        }
      }
      in_params_p = saved_in_params_p;
      if (!func_def_p) finish_scope (c2m_ctx);
      break;
    }
    default: abort ();
    }
    res = append_type (res, type);
  }
  return res;
}